

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grain_table.c
# Opt level: O0

void aom_film_grain_table_free(aom_film_grain_table_t *t)

{
  void *pvVar1;
  undefined8 *in_RDI;
  aom_film_grain_table_entry_t *next;
  aom_film_grain_table_entry_t *entry;
  void *memblk;
  
  memblk = (void *)*in_RDI;
  while (memblk != (void *)0x0) {
    pvVar1 = *(void **)((long)memblk + 0x298);
    aom_free(memblk);
    memblk = pvVar1;
  }
  memset(in_RDI,0,0x10);
  return;
}

Assistant:

void aom_film_grain_table_free(aom_film_grain_table_t *t) {
  aom_film_grain_table_entry_t *entry = t->head;
  while (entry) {
    aom_film_grain_table_entry_t *next = entry->next;
    aom_free(entry);
    entry = next;
  }
  memset(t, 0, sizeof(*t));
}